

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,Byte **bufOut)

{
  Byte **ppBVar1;
  CLzmaProb *pCVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint local_dc;
  SizeT local_d0;
  SizeT local_b8;
  int local_a0;
  uint local_9c;
  uint m;
  uint i;
  uint numDirectBits;
  uint posSlot;
  CLzmaProb *probLen;
  uint local_80;
  uint offset;
  uint limit;
  uint len;
  CLzmaProb *probLit;
  uint bit;
  uint symbol_1;
  uint offs;
  uint matchByte;
  uint symbol;
  uint posState;
  uint ttt;
  UInt32 bound;
  CLzmaProb *prob;
  ELzmaDummy res;
  uint state;
  CLzmaProb *probs;
  Byte *bufLimit;
  UInt32 code;
  UInt32 range;
  Byte **bufOut_local;
  Byte *buf_local;
  CLzmaDec *p_local;
  
  bufLimit._4_4_ = p->range;
  bufLimit._0_4_ = p->code;
  ppBVar1 = (Byte **)*bufOut;
  pCVar2 = p->probs_1664;
  uVar6 = p->state;
  uVar4 = (p->processedPos & (1 << ((p->prop).pb & 0x1f)) - 1U) * 0x10;
  bufOut_local = (Byte **)buf;
  if (bufLimit._4_4_ < 0x1000000) {
    if (ppBVar1 <= buf) {
      return DUMMY_INPUT_EOF;
    }
    bufLimit._4_4_ = bufLimit._4_4_ << 8;
    bufOut_local = (Byte **)(buf + 1);
    bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*buf;
  }
  uVar5 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)(uVar4 + uVar6) - 0x100];
  if ((UInt32)bufLimit < uVar5) {
    _ttt = pCVar2 + 0x140;
    if ((p->checkDicSize != 0) || (p->processedPos != 0)) {
      if (p->dicPos == 0) {
        local_b8 = p->dicBufSize;
      }
      else {
        local_b8 = p->dicPos;
      }
      _ttt = _ttt + (((p->processedPos & (1 << ((p->prop).lp & 0x1f)) - 1U) << ((p->prop).lc & 0x1f)
                     ) + (uint)(p->dic[local_b8 - 1] >> (8 - (p->prop).lc & 0x1f))) * 0x300;
    }
    bufLimit._4_4_ = uVar5;
    if (uVar6 < 7) {
      offs = 1;
      do {
        if (bufLimit._4_4_ < 0x1000000) {
          if (ppBVar1 <= bufOut_local) {
            return DUMMY_INPUT_EOF;
          }
          bufLimit._4_4_ = bufLimit._4_4_ << 8;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
          bufOut_local = (Byte **)((long)bufOut_local + 1);
        }
        uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[offs];
        if ((UInt32)bufLimit < uVar6) {
          offs = offs * 2;
          bufLimit._4_4_ = uVar6;
        }
        else {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar6;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
          offs = offs * 2 + 1;
        }
      } while (offs < 0x100);
    }
    else {
      if (p->dicPos < (ulong)p->reps[0]) {
        local_d0 = p->dicBufSize;
      }
      else {
        local_d0 = 0;
      }
      symbol_1 = (uint)p->dic[(p->dicPos - (ulong)p->reps[0]) + local_d0];
      bit = 0x100;
      probLit._4_4_ = 1;
      do {
        symbol_1 = symbol_1 * 2;
        uVar6 = symbol_1 & bit;
        if (bufLimit._4_4_ < 0x1000000) {
          if (ppBVar1 <= bufOut_local) {
            return DUMMY_INPUT_EOF;
          }
          bufLimit._4_4_ = bufLimit._4_4_ << 8;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
          bufOut_local = (Byte **)((long)bufOut_local + 1);
        }
        uVar4 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[uVar6 + bit + probLit._4_4_];
        if ((UInt32)bufLimit < uVar4) {
          probLit._4_4_ = probLit._4_4_ * 2;
          bit = bit ^ uVar6;
          bufLimit._4_4_ = uVar4;
        }
        else {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar4;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar4;
          probLit._4_4_ = probLit._4_4_ * 2 + 1;
          bit = uVar6;
        }
      } while (probLit._4_4_ < 0x100);
    }
    prob._0_4_ = DUMMY_LIT;
    uVar6 = bufLimit._4_4_;
  }
  else {
    bufLimit._4_4_ = bufLimit._4_4_ - uVar5;
    bufLimit._0_4_ = (UInt32)bufLimit - uVar5;
    if (bufLimit._4_4_ < 0x1000000) {
      if (ppBVar1 <= bufOut_local) {
        return DUMMY_INPUT_EOF;
      }
      bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
      bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)bufOut_local;
      bufOut_local = (Byte **)((long)bufOut_local + 1);
    }
    uVar5 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)uVar6 + 0x10];
    if ((UInt32)bufLimit < uVar5) {
      prob._4_4_ = 0;
      _ttt = pCVar2 + -0x300;
      prob._0_4_ = DUMMY_MATCH;
      bufLimit._4_4_ = uVar5;
    }
    else {
      bufLimit._4_4_ = bufLimit._4_4_ - uVar5;
      bufLimit._0_4_ = (UInt32)bufLimit - uVar5;
      prob._0_4_ = DUMMY_REP;
      if (bufLimit._4_4_ < 0x1000000) {
        if (ppBVar1 <= bufOut_local) {
          return DUMMY_INPUT_EOF;
        }
        bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
        bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)bufOut_local;
        bufOut_local = (Byte **)((long)bufOut_local + 1);
      }
      uVar5 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)uVar6 + 0x1c];
      if ((UInt32)bufLimit < uVar5) {
        bufLimit._4_4_ = uVar5;
        if (uVar5 < 0x1000000) {
          if (ppBVar1 <= bufOut_local) {
            return DUMMY_INPUT_EOF;
          }
          bufLimit._4_4_ = uVar5 * 0x100;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
          bufOut_local = (Byte **)((long)bufOut_local + 1);
        }
        uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)(uVar4 + uVar6) - 0x600];
        if ((UInt32)bufLimit < uVar6) goto LAB_001cd955;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
        uVar5 = bufLimit._4_4_ - uVar6;
      }
      else {
        bufLimit._4_4_ = bufLimit._4_4_ - uVar5;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar5;
        if (bufLimit._4_4_ < 0x1000000) {
          if (ppBVar1 <= bufOut_local) {
            return DUMMY_INPUT_EOF;
          }
          bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
          bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)bufOut_local;
          bufOut_local = (Byte **)((long)bufOut_local + 1);
        }
        uVar5 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)uVar6 + 0x28];
        if (uVar5 <= (UInt32)bufLimit) {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar5;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar5;
          if (bufLimit._4_4_ < 0x1000000) {
            if (ppBVar1 <= bufOut_local) {
              return DUMMY_INPUT_EOF;
            }
            bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
            bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)bufOut_local;
            bufOut_local = (Byte **)((long)bufOut_local + 1);
          }
          uVar5 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)uVar6 + 0x34];
          if (uVar5 <= (UInt32)bufLimit) {
            bufLimit._0_4_ = (UInt32)bufLimit - uVar5;
            uVar5 = bufLimit._4_4_ - uVar5;
          }
        }
      }
      bufLimit._4_4_ = uVar5;
      prob._4_4_ = 0xc;
      _ttt = pCVar2 + -0x500;
    }
    if (bufLimit._4_4_ < 0x1000000) {
      if (ppBVar1 <= bufOut_local) {
        return DUMMY_INPUT_EOF;
      }
      bufLimit._4_4_ = bufLimit._4_4_ << 8;
      bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
      bufOut_local = (Byte **)((long)bufOut_local + 1);
    }
    uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)*_ttt;
    if ((UInt32)bufLimit < uVar6) {
      _numDirectBits = _ttt + uVar4;
      probLen._4_4_ = 0;
      local_80 = 8;
      bufLimit._4_4_ = uVar6;
    }
    else {
      bufLimit._4_4_ = bufLimit._4_4_ - uVar6;
      bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
      if (bufLimit._4_4_ < 0x1000000) {
        if (ppBVar1 <= bufOut_local) {
          return DUMMY_INPUT_EOF;
        }
        bufLimit._4_4_ = bufLimit._4_4_ * 0x100;
        bufLimit._0_4_ = (UInt32)bufLimit * 0x100 | (uint)*(byte *)bufOut_local;
        bufOut_local = (Byte **)((long)bufOut_local + 1);
      }
      uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[8];
      if ((UInt32)bufLimit < uVar6) {
        _numDirectBits = _ttt + (ulong)uVar4 + 8;
        probLen._4_4_ = 8;
        local_80 = 8;
        bufLimit._4_4_ = uVar6;
      }
      else {
        bufLimit._4_4_ = bufLimit._4_4_ - uVar6;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
        _numDirectBits = _ttt + 0x100;
        probLen._4_4_ = 0x10;
        local_80 = 0x100;
      }
    }
    offset = 1;
    do {
      if (bufLimit._4_4_ < 0x1000000) {
        if (ppBVar1 <= bufOut_local) {
          return DUMMY_INPUT_EOF;
        }
        bufLimit._4_4_ = bufLimit._4_4_ << 8;
        bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
        bufOut_local = (Byte **)((long)bufOut_local + 1);
      }
      uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)_numDirectBits[offset];
      if ((UInt32)bufLimit < uVar6) {
        offset = offset * 2;
        bufLimit._4_4_ = uVar6;
      }
      else {
        bufLimit._4_4_ = bufLimit._4_4_ - uVar6;
        bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
        offset = offset * 2 + 1;
      }
    } while (offset < local_80);
    local_dc = probLen._4_4_ + (offset - local_80);
    uVar6 = bufLimit._4_4_;
    if (prob._4_4_ < 4) {
      if (2 < local_dc) {
        local_dc = 3;
      }
      i = 1;
      do {
        if (bufLimit._4_4_ < 0x1000000) {
          if (ppBVar1 <= bufOut_local) {
            return DUMMY_INPUT_EOF;
          }
          bufLimit._4_4_ = bufLimit._4_4_ << 8;
          bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
          bufOut_local = (Byte **)((long)bufOut_local + 1);
        }
        uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)pCVar2[(ulong)(local_dc << 6) + (ulong)i + 0x40];
        if ((UInt32)bufLimit < uVar6) {
          i = i * 2;
          bufLimit._4_4_ = uVar6;
        }
        else {
          bufLimit._4_4_ = bufLimit._4_4_ - uVar6;
          bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
          i = i * 2 + 1;
        }
      } while (i < 0x40);
      uVar4 = i - 0x40;
      uVar6 = bufLimit._4_4_;
      if (3 < uVar4) {
        m = (uVar4 >> 1) - 1;
        if (uVar4 < 0xe) {
          _ttt = pCVar2 + ((ulong)((uVar4 & 1 | 2) << ((byte)m & 0x1f)) - 0x680);
        }
        else {
          m = (uVar4 >> 1) - 5;
          do {
            if (bufLimit._4_4_ < 0x1000000) {
              if (ppBVar1 <= bufOut_local) {
                return DUMMY_INPUT_EOF;
              }
              bufLimit._4_4_ = bufLimit._4_4_ << 8;
              bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
              bufOut_local = (Byte **)((long)bufOut_local + 1);
            }
            bufLimit._4_4_ = bufLimit._4_4_ >> 1;
            bufLimit._0_4_ =
                 (UInt32)bufLimit -
                 (bufLimit._4_4_ & 0xffffffffU - ((int)((UInt32)bufLimit - bufLimit._4_4_) >> 0x1f))
            ;
            m = m - 1;
          } while (m != 0);
          m = 4;
          _ttt = pCVar2;
        }
        local_9c = 1;
        local_a0 = 1;
        do {
          if (bufLimit._4_4_ < 0x1000000) {
            if (ppBVar1 <= bufOut_local) {
              return DUMMY_INPUT_EOF;
            }
            bufLimit._4_4_ = bufLimit._4_4_ << 8;
            bufLimit._0_4_ = (UInt32)bufLimit << 8 | (uint)*(byte *)bufOut_local;
            bufOut_local = (Byte **)((long)bufOut_local + 1);
          }
          uVar6 = (bufLimit._4_4_ >> 0xb) * (uint)_ttt[local_9c];
          iVar3 = local_a0;
          if (uVar6 <= (UInt32)bufLimit) {
            bufLimit._0_4_ = (UInt32)bufLimit - uVar6;
            uVar6 = bufLimit._4_4_ - uVar6;
            iVar3 = local_a0 * 2;
          }
          bufLimit._4_4_ = uVar6;
          local_a0 = local_a0 * 2;
          local_9c = iVar3 + local_9c;
          m = m - 1;
          uVar6 = bufLimit._4_4_;
        } while (m != 0);
      }
    }
  }
LAB_001cd955:
  bufLimit._4_4_ = uVar6;
  if (bufLimit._4_4_ < 0x1000000) {
    if (ppBVar1 <= bufOut_local) {
      return DUMMY_INPUT_EOF;
    }
    bufOut_local = (Byte **)((long)bufOut_local + 1);
  }
  *bufOut = (Byte *)bufOut_local;
  return (ELzmaDummy)prob;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, const Byte **bufOut)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = *bufOut;
  const CLzmaProb *probs = GET_PROBS;
  unsigned state = (unsigned)p->state;
  ELzmaDummy res;

  for (;;)
  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = CALC_POS_STATE(p->processedPos, ((unsigned)1 << p->prop.pb) - 1);

    prob = probs + IsMatch + COMBINED_PS_STATE;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & (((unsigned)1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            ((unsigned)p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte += matchByte;
          bit = offs;
          offs &= matchByte;
          probLit = prob + (offs + bit + symbol);
          GET_BIT2_CHECK(probLit, symbol, offs ^= bit; , ; )
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK
          prob = probs + IsRep0Long + COMBINED_PS_STATE;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
            break;
          }
          else
          {
            UPDATE_1_CHECK
          }
        }
        else
        {
          UPDATE_1_CHECK
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
          }
          else
          {
            UPDATE_1_CHECK
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK
            }
            else
            {
              UPDATE_1_CHECK
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }